

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# HighsLpRelaxation.cpp
# Opt level: O2

Status __thiscall HighsLpRelaxation::run(HighsLpRelaxation *this,bool resolve_on_error)

{
  Highs *this_00;
  double dVar1;
  HighsModelStatus model_status;
  HighsOptions *pHVar2;
  HighsStatus HVar3;
  HighsInt HVar4;
  Status SVar5;
  ulong uVar6;
  size_t in_RCX;
  long lVar7;
  void *__buf;
  void *__buf_00;
  int iVar8;
  undefined7 in_register_00000031;
  uint uVar9;
  double extraout_XMM0_Qa;
  double dVar10;
  allocator local_55c9;
  string local_55c8;
  undefined4 local_55a4;
  double local_55a0;
  double local_5598;
  double local_5590;
  HighsLp local_5588;
  Highs ipm;
  
  this_00 = &this->lpsolver;
  local_5590 = Highs::getRunTime(this_00);
  local_5598 = (this->mipsolver->options_mip_->super_HighsOptionsStruct).time_limit;
  HighsTimer::read(&this->mipsolver->timer_,0,__buf,in_RCX);
  local_55a0 = extraout_XMM0_Qa;
  std::__cxx11::string::string((string *)&ipm,"time_limit",(allocator *)&local_55c8);
  local_55a4 = (undefined4)CONCAT71(in_register_00000031,resolve_on_error);
  local_55a0 = (local_5590 + local_5598) - local_55a0;
  dVar10 = 0.0;
  if (0.0 <= local_55a0) {
    dVar10 = local_55a0;
  }
  Highs::setOptionValue(this_00,(string *)&ipm,dVar10);
  std::__cxx11::string::~string((string *)&ipm);
  uVar9 = (uint)(this->lpsolver).basis_.valid;
  iVar8 = 0x3a - uVar9;
  HighsMipAnalysis::mipTimerStart(&this->mipsolver->analysis_,iVar8);
  HVar3 = Highs::run(this_00);
  HighsMipAnalysis::mipTimerStop(&this->mipsolver->analysis_,iVar8);
  if (((uVar9 == 0) && ((this->mipsolver->analysis_).analyse_mip_time != false)) &&
     (HVar4 = HighsMipAnalysis::mipTimerNumCall(&this->mipsolver->analysis_,iVar8), HVar4 == 1)) {
    pHVar2 = this->mipsolver->options_mip_;
    HighsTimer::read(&this->mipsolver->timer_,0,__buf_00,in_RCX);
    highsLogUser(&(pHVar2->super_HighsOptionsStruct).log_options,kInfo,
                 "MIP-Timing: %11.2g - return from first root LP solve\n");
  }
  uVar9 = (this->lpsolver).info_.super_HighsInfoStruct.simplex_iteration_count;
  uVar6 = 0;
  if (0 < (int)uVar9) {
    uVar6 = (ulong)uVar9;
  }
  this->numlpiters = this->numlpiters + uVar6;
  SVar5 = kError;
  if (HVar3 == kError) {
    Highs::clearSolver(this_00);
    if ((char)local_55a4 == '\0') {
      recoverBasis(this);
      return kError;
    }
    std::__cxx11::string::string((string *)&ipm,"simplex_strategy",(allocator *)&local_55c8);
    Highs::setOptionValue(this_00,(string *)&ipm,1);
    std::__cxx11::string::~string((string *)&ipm);
    std::__cxx11::string::string((string *)&ipm,"presolve",(allocator *)&local_55c8);
    Highs::setOptionValue(this_00,(string *)&ipm,&::kHighsOnString_abi_cxx11_);
    std::__cxx11::string::~string((string *)&ipm);
    SVar5 = run(this,false);
    std::__cxx11::string::string((string *)&ipm,"presolve",(allocator *)&local_55c8);
    Highs::setOptionValue(this_00,(string *)&ipm,&::kHighsOffString_abi_cxx11_);
LAB_002b8581:
    std::__cxx11::string::~string((string *)&ipm);
    return SVar5;
  }
  model_status = (this->lpsolver).model_status_;
  iVar8 = (int)uVar6;
  switch(model_status) {
  case kInfeasible:
    lVar7 = this->numSolved + 1;
    this->numSolved = lVar7;
    this->avgSolveIters =
         ((double)iVar8 - this->avgSolveIters) / (double)lVar7 + this->avgSolveIters;
    storeDualInfProof(this);
    goto LAB_002b88a1;
  default:
    pHVar2 = this->mipsolver->options_mip_;
    Highs::modelStatusToString_abi_cxx11_((string *)&ipm,this_00,model_status);
    highsLogUser(&(pHVar2->super_HighsOptionsStruct).log_options,kWarning,
                 "LP solved to unexpected status: %s\n",ipm._vptr_Highs);
    goto LAB_002b8581;
  case kUnbounded:
    if ((this->lpsolver).info_.super_HighsInfoStruct.basis_validity == 0) {
      highsLogUser(&(this->mipsolver->options_mip_->super_HighsOptionsStruct).log_options,kWarning,
                   "HighsLpRelaxation::run LP is unbounded with no basis, but not returning Status::kError\n"
                  );
    }
    SVar5 = kUnbounded;
    if ((this->lpsolver).info_.super_HighsInfoStruct.primal_solution_status == 2) {
      HighsMipSolverData::trySolution
                ((this->mipsolver->mipdata_)._M_t.
                 super___uniq_ptr_impl<HighsMipSolverData,_std::default_delete<HighsMipSolverData>_>
                 ._M_t.
                 super__Tuple_impl<0UL,_HighsMipSolverData_*,_std::default_delete<HighsMipSolverData>_>
                 .super__Head_base<0UL,_HighsMipSolverData_*,_false>._M_head_impl,
                 &(this->lpsolver).solution_.col_value,9);
    }
    break;
  case kObjectiveBound:
    lVar7 = this->numSolved + 1;
    this->numSolved = lVar7;
    this->avgSolveIters =
         ((double)iVar8 - this->avgSolveIters) / (double)lVar7 + this->avgSolveIters;
    storeDualUBProof(this);
LAB_002b88a1:
    SVar5 = kInfeasible;
    break;
  case kTimeLimit:
    break;
  case kIterationLimit:
    if (((char)local_55a4 != '\0') && (this->mipsolver->submip == false)) {
      Highs::Highs(&ipm);
      std::__cxx11::string::string((string *)&local_55c8,"output_flag",&local_55c9);
      Highs::setOptionValue(&ipm,&local_55c8,false);
      std::__cxx11::string::~string((string *)&local_55c8);
      std::__cxx11::string::string((string *)&local_55c8,"solver",&local_55c9);
      Highs::setOptionValue(&ipm,&local_55c8,"ipm");
      std::__cxx11::string::~string((string *)&local_55c8);
      std::__cxx11::string::string((string *)&local_55c8,"ipm_iteration_limit",&local_55c9);
      Highs::setOptionValue(&ipm,&local_55c8,200);
      std::__cxx11::string::~string((string *)&local_55c8);
      if ((this->mipsolver->options_mip_->super_HighsOptionsStruct).mip_root_presolve_only == true)
      {
        std::__cxx11::string::string((string *)&local_55c8,"presolve",&local_55c9);
        Highs::setOptionValue(&ipm,&local_55c8,&::kHighsOffString_abi_cxx11_);
        std::__cxx11::string::~string((string *)&local_55c8);
      }
      HighsLp::HighsLp(&local_5588,&(this->lpsolver).model_.lp_);
      Highs::passModel(&ipm,&local_5588);
      HighsLp::~HighsLp(&local_5588);
      std::__cxx11::string::string((string *)&local_55c8,"simplex_iteration_limit",&local_55c9);
      Highs::setOptionValue
                (&ipm,&local_55c8,
                 (this->lpsolver).info_.super_HighsInfoStruct.simplex_iteration_count);
      std::__cxx11::string::~string((string *)&local_55c8);
      HighsMipAnalysis::mipTimerStart(&this->mipsolver->analysis_,0x3b);
      Highs::run(&ipm);
      HighsMipAnalysis::mipTimerStop(&this->mipsolver->analysis_,0x3b);
      std::__cxx11::string::string
                ((string *)&local_55c8,"HighsLpRelaxation::run IPM basis",&local_55c9);
      Highs::setBasis(this_00,&ipm.basis_,&local_55c8);
      std::__cxx11::string::~string((string *)&local_55c8);
      SVar5 = run(this,false);
      Highs::~Highs(&ipm);
    }
    break;
  case kUnknown:
    if ((this->lpsolver).info_.super_HighsInfoStruct.basis_validity == 0) {
      return kError;
    }
  case kOptimal:
    lVar7 = this->numSolved + 1;
    this->numSolved = lVar7;
    this->avgSolveIters =
         ((double)iVar8 - this->avgSolveIters) / (double)lVar7 + this->avgSolveIters;
    dVar10 = ((this->mipsolver->mipdata_)._M_t.
              super___uniq_ptr_impl<HighsMipSolverData,_std::default_delete<HighsMipSolverData>_>.
              _M_t.
              super__Tuple_impl<0UL,_HighsMipSolverData_*,_std::default_delete<HighsMipSolverData>_>
              .super__Head_base<0UL,_HighsMipSolverData_*,_false>._M_head_impl)->feastol;
    dVar1 = (this->lpsolver).info_.super_HighsInfoStruct.max_dual_infeasibility;
    if ((this->lpsolver).info_.super_HighsInfoStruct.max_primal_infeasibility <= dVar10) {
      if (dVar1 <= dVar10) {
        SVar5 = kOptimal;
      }
      else {
        SVar5 = kUnscaledPrimalFeasible;
      }
    }
    else if (dVar10 < dVar1) {
      SVar5 = (uint)(model_status != kOptimal) * 2 + kUnscaledInfeasible;
    }
    else {
      SVar5 = kUnscaledDualFeasible;
    }
  }
  return SVar5;
}

Assistant:

HighsLpRelaxation::Status HighsLpRelaxation::run(bool resolve_on_error) {
  const double this_time_limit =
      std::max(lpsolver.getRunTime() + mipsolver.options_mip_->time_limit -
                   mipsolver.timer_.read(),
               0.0);
  lpsolver.setOptionValue("time_limit", this_time_limit);
  // lpsolver.setOptionValue("output_flag", true);
  const bool valid_basis = lpsolver.getBasis().valid;
  const HighsInt simplex_solve_clock = valid_basis
                                           ? kMipClockSimplexBasisSolveLp
                                           : kMipClockSimplexNoBasisSolveLp;
  const bool dev_report = false;
  if (dev_report && !mipsolver.submip) {
    if (valid_basis) {
      printf("Solving LP (%7d, %7d) with    a valid basis\n",
             int(lpsolver.getNumCol()), int(lpsolver.getNumRow()));
    } else {
      printf("Solving LP (%7d, %7d) without a valid basis\n",
             int(lpsolver.getNumCol()), int(lpsolver.getNumRow()));
    }
  }
  const bool solver_logging = false;
  const bool detailed_simplex_logging = false;
  if (solver_logging) lpsolver.setOptionValue("output_flag", true);
  if (detailed_simplex_logging) {
    lpsolver.setOptionValue("output_flag", true);
    lpsolver.setOptionValue("log_dev_level", kHighsLogDevLevelVerbose);
    lpsolver.setOptionValue("highs_analysis_level",
                            kHighsAnalysisLevelSolverRuntimeData);
  }

  mipsolver.analysis_.mipTimerStart(simplex_solve_clock);
  HighsStatus callstatus = lpsolver.run();
  mipsolver.analysis_.mipTimerStop(simplex_solve_clock);
  if (mipsolver.analysis_.analyse_mip_time && !valid_basis &&
      mipsolver.analysis_.mipTimerNumCall(simplex_solve_clock) == 1)
    highsLogUser(mipsolver.options_mip_->log_options, HighsLogType::kInfo,
                 "MIP-Timing: %11.2g - return from first root LP solve\n",
                 mipsolver.timer_.read());
  const HighsInfo& info = lpsolver.getInfo();
  HighsInt itercount = std::max(HighsInt{0}, info.simplex_iteration_count);
  numlpiters += itercount;

  if (callstatus == HighsStatus::kError) {
    lpsolver.clearSolver();
#if 0
    // first try to use the primal simplex solver starting from the last basis
    if (lpsolver.getOptions().simplex_strategy == kSimplexStrategyDual) {
      lpsolver.setOptionValue("simplex_strategy", kSimplexStrategyPrimal);
      recoverBasis();
      auto retval = run(resolve_on_error);
      lpsolver.setOptionValue("simplex_strategy", kSimplexStrategyDual);

      return retval;
    }
#endif

    if (resolve_on_error) {
      // still an error: now try to solve with presolve from scratch
      lpsolver.setOptionValue("simplex_strategy", kSimplexStrategyDual);
      lpsolver.setOptionValue("presolve", kHighsOnString);
      auto retval = run(false);
      lpsolver.setOptionValue("presolve", kHighsOffString);

      return retval;
    }

    recoverBasis();

    return Status::kError;
  }

  // Was
  //  HighsModelStatus scaledmodelstatus = lpsolver.getModelStatus(true);
  HighsModelStatus model_status = lpsolver.getModelStatus();
  switch (model_status) {
    case HighsModelStatus::kObjectiveBound:
      ++numSolved;
      avgSolveIters +=
          (itercount - avgSolveIters) / static_cast<double>(numSolved);

      storeDualUBProof();
      return Status::kInfeasible;
    case HighsModelStatus::kInfeasible: {
      ++numSolved;
      avgSolveIters +=
          (itercount - avgSolveIters) / static_cast<double>(numSolved);

      storeDualInfProof();
      if (true || checkDualProof()) return Status::kInfeasible;
      // /printf("infeasibility proof not valid\n");
      hasdualproof = false;

      // HighsInt scalestrategy = lpsolver.getOptions().simplex_scale_strategy;
      // if (scalestrategy != kSimplexScaleStrategyOff) {
      //   lpsolver.setOptionValue("simplex_scale_strategy",
      //                           kSimplexScaleStrategyOff);
      //   HighsBasis basis = lpsolver.getBasis();
      //   lpsolver.clearSolver();
      //   lpsolver.setBasis(basis);
      //   auto tmp = run(resolve_on_error);
      //   lpsolver.setOptionValue("simplex_scale_strategy", scalestrategy);
      //   if (!scaledOptimal(tmp)) {
      //     lpsolver.clearSolver();
      //     lpsolver.setBasis(basis);
      //   }
      //   return tmp;
      // }
      //
      // // trust the primal simplex result without scaling
      // if (lpsolver.getModelStatus() == HighsModelStatus::kInfeasible)
      //   return Status::kInfeasible;

      // highsLogUser(mipsolver.options_mip_->log_options,
      //                 HighsLogType::kWarning,
      //                 "LP failed to reliably determine infeasibility\n");

      // printf("error: unreliable infeasibilities, modelstatus = %"
      // HIGHSINT_FORMAT " (scaled
      // %" HIGHSINT_FORMAT ")\n",
      //        (HighsInt)lpsolver.getModelStatus(),
      //        (HighsInt)lpsolver.getModelStatus(true));
      return Status::kError;
    }
    case HighsModelStatus::kUnbounded:
      // If unboundedness is detected in the presolved LP, then
      // postsolve cannot be run, so there is no basis. Returning
      // Status::kError as a result yielded #1962, where the root node
      // is unbounded.
      if (info.basis_validity == kBasisValidityInvalid)
        highsLogUser(mipsolver.options_mip_->log_options,
                     HighsLogType::kWarning,
                     "HighsLpRelaxation::run LP is unbounded with no basis, "
                     "but not returning Status::kError\n");
      if (info.primal_solution_status == kSolutionStatusFeasible)
        mipsolver.mipdata_->trySolution(lpsolver.getSolution().col_value,
                                        kSolutionSourceUnbounded);

      return Status::kUnbounded;
    case HighsModelStatus::kUnknown:
      if (info.basis_validity == kBasisValidityInvalid) return Status::kError;
      // fall through
    case HighsModelStatus::kOptimal:
      assert(info.max_primal_infeasibility >= 0);
      assert(info.max_dual_infeasibility >= 0);
      ++numSolved;
      avgSolveIters +=
          (itercount - avgSolveIters) / static_cast<double>(numSolved);
      if (info.max_primal_infeasibility <= mipsolver.mipdata_->feastol &&
          info.max_dual_infeasibility <= mipsolver.mipdata_->feastol)
        return Status::kOptimal;

      if (info.max_primal_infeasibility <= mipsolver.mipdata_->feastol)
        return Status::kUnscaledPrimalFeasible;

      if (info.max_dual_infeasibility <= mipsolver.mipdata_->feastol)
        return Status::kUnscaledDualFeasible;

      if (model_status == HighsModelStatus::kOptimal)
        return Status::kUnscaledInfeasible;

      return Status::kError;
    case HighsModelStatus::kIterationLimit: {
      if (!mipsolver.submip && resolve_on_error) {
        // printf(
        //     "error: lpsolver reached iteration limit, resolving with basis "
        //     "from ipm\n");
        Highs ipm;
        ipm.setOptionValue("output_flag", false);
        ipm.setOptionValue("solver", "ipm");
        ipm.setOptionValue("ipm_iteration_limit", 200);
        // check if only root presolve is allowed
        if (mipsolver.options_mip_->mip_root_presolve_only)
          ipm.setOptionValue("presolve", kHighsOffString);
        ipm.passModel(lpsolver.getLp());
        // todo @ Julian : If you remove this you can see the looping on
        // istanbul-no-cutoff
        ipm.setOptionValue("simplex_iteration_limit",
                           info.simplex_iteration_count);
        mipsolver.analysis_.mipTimerStart(kMipClockIpmSolveLp);
        ipm.run();
        mipsolver.analysis_.mipTimerStop(kMipClockIpmSolveLp);
        lpsolver.setBasis(ipm.getBasis(), "HighsLpRelaxation::run IPM basis");
        return run(false);
      }

      // printf("error: lpsolver reached iteration limit\n");
      return Status::kError;
    }
    case HighsModelStatus::kTimeLimit:
      return Status::kError;
    default:
      // printf("error: lpsolver stopped with unexpected status %"
      // HIGHSINT_FORMAT "\n",
      //        (HighsInt)model_status);
      highsLogUser(mipsolver.options_mip_->log_options, HighsLogType::kWarning,
                   "LP solved to unexpected status: %s\n",
                   lpsolver.modelStatusToString(model_status).c_str());
      return Status::kError;
  }
}